

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

bool __thiscall smf::MidiFile::writeBinasc(MidiFile *this,ostream *output)

{
  ssize_t sVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *__buf;
  undefined1 local_1cc [8];
  Binasc binasc;
  stringstream local_1a8 [8];
  stringstream binarydata;
  undefined1 local_198 [376];
  ostream *local_20;
  ostream *output_local;
  MidiFile *this_local;
  
  local_20 = output;
  output_local = (ostream *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  sVar1 = write(this,(int)local_198,__buf,CONCAT71(in_register_00000009,in_CL));
  this->m_rwstatus = (bool)((byte)sVar1 & 1);
  if ((this->m_rwstatus & 1U) == 0) {
    this_local._7_1_ = 0;
    binasc.m_maxLineLength = 1;
  }
  else {
    Binasc::Binasc((Binasc *)local_1cc);
    Binasc::setMidiOn((Binasc *)local_1cc);
    std::istream::seekg((long)local_1a8,_S_beg);
    Binasc::readFromBinary((Binasc *)local_1cc,local_20,(istream *)local_1a8);
    this_local._7_1_ = 1;
    binasc.m_maxLineLength = 1;
    Binasc::~Binasc((Binasc *)local_1cc);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MidiFile::writeBinasc(std::ostream& output) {
	std::stringstream binarydata;
	m_rwstatus = write(binarydata);
	if (m_rwstatus == false) {
		return false;
	}

	Binasc binasc;
	binasc.setMidiOn();
	binarydata.seekg(0, std::ios_base::beg);
	binasc.readFromBinary(output, binarydata);
	return true;
}